

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O1

const_iterator * __thiscall
supermap::io::RamFileManager::getFileIterator
          (const_iterator *__return_storage_ptr__,RamFileManager *this,path *file)

{
  pointer pcVar1;
  FileException *this_00;
  string local_68;
  string local_48;
  
  getFileIteratorNoThrow(__return_storage_ptr__,this,file);
  if (__return_storage_ptr__->_M_cur != *(_Elt_pointer *)&this->field_0x38) {
    return __return_storage_ptr__;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (file->_M_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (file->_M_pathname)._M_string_length);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Not found","");
  FileException::FileException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&FileException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::deque<RamFileManager::File>::const_iterator RamFileManager::getFileIterator(
    const std::filesystem::path &file) const {
    auto it = getFileIteratorNoThrow(file);
    if (it == files.end()) {
        throw FileException(file, "Not found");
    }
    return it;
}